

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall vera::Mesh::append(Mesh *this,Mesh *_mesh)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer puVar3;
  uint uVar4;
  ostream *poVar5;
  
  if (_mesh->m_drawMode == this->m_drawMode) {
    pvVar1 = (this->m_vertices).
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar2 = (this->m_vertices).
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    addColors(this,&_mesh->m_colors);
    addVertices(this,&_mesh->m_vertices);
    addNormals(this,&_mesh->m_normals);
    addTexCoords(this,&_mesh->m_texCoords);
    uVar4 = 0;
    while( true ) {
      puVar3 = (_mesh->m_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(_mesh->m_indices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3 >> 2) <= (ulong)uVar4)
      break;
      addIndex(this,puVar3[uVar4] + (int)(((long)pvVar1 - (long)pvVar2) / 0xc));
      uVar4 = uVar4 + 1;
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"INCOMPATIBLE DRAW MODES");
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void Mesh::addVertices(const std::vector<glm::vec3>& _verts) {
   m_vertices.insert(m_vertices.end(),_verts.begin(),_verts.end());
}